

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O0

REF_STATUS
ref_facelift_edge_face_uv
          (REF_FACELIFT ref_facelift,REF_INT edgeid,REF_INT faceid,REF_INT sense,REF_DBL t,
          REF_DBL *uv)

{
  REF_GEOM ref_geom_00;
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_INT geom;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  uint local_230;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL faceuv [2];
  REF_DBL clipv [3];
  REF_DBL local_1e8;
  REF_DBL clipu [3];
  REF_DBL local_1c8;
  REF_DBL bary [3];
  REF_INT local_1a8;
  REF_INT tuv_sense;
  REF_INT linear_nodes [27];
  REF_INT tri_nodes [27];
  REF_INT local_c4;
  REF_INT edg_tri;
  REF_INT cells [2];
  REF_INT ncell;
  REF_INT edg_nodes [27];
  REF_INT cell;
  REF_INT cell_node;
  REF_INT i;
  REF_GEOM ref_geom;
  REF_DBL *uv_local;
  REF_DBL t_local;
  REF_INT local_20;
  REF_INT sense_local;
  REF_INT faceid_local;
  REF_INT edgeid_local;
  REF_FACELIFT ref_facelift_local;
  
  ref_geom_00 = ref_facelift->grid->geom;
  uv_local = (REF_DBL *)t;
  t_local._4_4_ = sense;
  local_20 = faceid;
  sense_local = edgeid;
  _faceid_local = ref_facelift;
  ref_private_macro_code_rss_2 = ref_egads_edge_face_uv(ref_geom_00,edgeid,faceid,sense,t,uv);
  if (ref_private_macro_code_rss_2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x367,"ref_facelift_edge_face_uv",(ulong)(uint)ref_private_macro_code_rss_2,"edge uv");
    return ref_private_macro_code_rss_2;
  }
  if (_faceid_local->displacement == (REF_DBL *)0x0) {
    if (t_local._4_4_ != 0) {
      return 0;
    }
    ref_private_macro_code_rss_3 =
         ref_facelift_enclosing
                   (_faceid_local,1,sense_local,(REF_DBL *)&uv_local,edg_nodes + 0x19,&local_1c8);
    if (ref_private_macro_code_rss_3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x371,"ref_facelift_edge_face_uv",(ulong)(uint)ref_private_macro_code_rss_3,"enclose");
      return ref_private_macro_code_rss_3;
    }
    if (edg_nodes[0x19] == -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x372,"ref_facelift_edge_face_uv","no enclosing found");
      return 1;
    }
    ref_private_macro_code_rss_4 = ref_node_clip_bary2(&local_1c8,&local_1e8);
    if (ref_private_macro_code_rss_4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x373,"ref_facelift_edge_face_uv",(ulong)(uint)ref_private_macro_code_rss_4,
             "clip edge bary");
      return ref_private_macro_code_rss_4;
    }
    ref_private_macro_code_rss_5 = ref_node_clip_bary2(&local_1c8,faceuv + 1);
    if (ref_private_macro_code_rss_5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x374,"ref_facelift_edge_face_uv",(ulong)(uint)ref_private_macro_code_rss_5,
             "clip edge bary");
      return ref_private_macro_code_rss_5;
    }
    ref_private_macro_code_rss_6 = ref_cell_nodes(_faceid_local->edg_cell,edg_nodes[0x19],cells + 1)
    ;
    if (ref_private_macro_code_rss_6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x376,"ref_facelift_edge_face_uv",(ulong)(uint)ref_private_macro_code_rss_6,"edg nodes"
            );
      return ref_private_macro_code_rss_6;
    }
    local_230 = ref_cell_list_with2(_faceid_local->tri_cell,cells[1],ncell,2,cells,&local_c4);
    if (local_230 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x379,"ref_facelift_edge_face_uv",(ulong)local_230,"more then two tris for edg");
      return local_230;
    }
    if (cells[0] < 1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x37a,"ref_facelift_edge_face_uv","no tri found for edg");
      return 1;
    }
    tri_nodes[0x1a] = -1;
    local_230 = 0;
    for (cell = 0; cell < cells[0]; cell = cell + 1) {
      ref_private_status_reis_ai._4_4_ =
           ref_cell_nodes(_faceid_local->tri_cell,(&local_c4)[cell],linear_nodes + 0x1a);
      if (ref_private_status_reis_ai._4_4_ != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x37e,"ref_facelift_edge_face_uv",(ulong)ref_private_status_reis_ai._4_4_,"tri nodes"
              );
        return ref_private_status_reis_ai._4_4_;
      }
      if (local_20 == linear_nodes[(long)_faceid_local->tri_cell->node_per + 0x1a]) {
        ref_private_status_reis_bi = -1;
        _geom = (long)tri_nodes[0x1a];
        if (_geom != -1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x381,"ref_facelift_edge_face_uv","two tri found with id and sense=0",
                 0xffffffffffffffff,_geom);
          return 1;
        }
        tri_nodes[0x1a] = (&local_c4)[cell];
        _geom = 0xffffffffffffffff;
      }
      ref_private_status_reis_ai._4_4_ = 0;
    }
    if (tri_nodes[0x1a] == -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x385,"ref_facelift_edge_face_uv","edg tri not found with id");
      return 1;
    }
    ref_private_macro_code_rss_8 =
         ref_cell_nodes(_faceid_local->tri_cell,tri_nodes[0x1a],linear_nodes + 0x1a);
    if (ref_private_macro_code_rss_8 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x387,"ref_facelift_edge_face_uv",(ulong)(uint)ref_private_macro_code_rss_8,
             "edg tri nodes");
      return ref_private_macro_code_rss_8;
    }
    local_1a8 = linear_nodes[0x1a];
    linear_nodes[1] = linear_nodes[(long)_faceid_local->tri_cell->node_per + 0x1a];
    uVar1 = ref_geom_find(ref_geom_00,cells[1],2,local_20,&ref_private_macro_code_rss_9);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x391,"ref_facelift_edge_face_uv",(ulong)uVar1,"geom");
      return uVar1;
    }
    if (0 < ref_geom_00->descr[ref_private_macro_code_rss_9 * 6 + 4]) {
      faceuv[1] = 0.0;
    }
    if (ref_geom_00->descr[ref_private_macro_code_rss_9 * 6 + 4] < 0) {
      local_1e8 = 0.0;
      clipu[0] = 1.0;
    }
    uVar1 = ref_geom_find(ref_geom_00,ncell,2,local_20,&ref_private_macro_code_rss_9);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x39b,"ref_facelift_edge_face_uv",(ulong)uVar1,"geom");
      return uVar1;
    }
    if (0 < ref_geom_00->descr[ref_private_macro_code_rss_9 * 6 + 4]) {
      faceuv[1] = 1.0;
    }
    if (ref_geom_00->descr[ref_private_macro_code_rss_9 * 6 + 4] < 0) {
      local_1e8 = 1.0;
      clipu[0] = 0.0;
    }
    *uv = 0.0;
    uv[1] = 0.0;
    for (edg_nodes[0x1a] = 0; edg_nodes[0x1a] < 2; edg_nodes[0x1a] = edg_nodes[0x1a] + 1) {
      uVar1 = ref_geom_cell_tuv(ref_geom_00,cells[(long)edg_nodes[0x1a] + 1],&local_1a8,2,
                                (REF_DBL *)&ref_private_macro_code_rss_1,
                                (REF_INT *)((long)bary + 0x14));
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x3ab,"ref_facelift_edge_face_uv",(ulong)uVar1,"face uv");
        return uVar1;
      }
      *uv = clipu[(long)edg_nodes[0x1a] + -1] * _ref_private_macro_code_rss_1 + *uv;
      uv[1] = faceuv[(long)edg_nodes[0x1a] + 1] * faceuv[0] + uv[1];
    }
    uVar1 = ref_facelift_edge_face_watertight
                      (_faceid_local,sense_local,local_20,t_local._4_4_,(REF_DBL)uv_local,uv);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x3b2,"ref_facelift_edge_face_uv",(ulong)uVar1,"facelift watertight check");
      return uVar1;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_edge_face_uv(REF_FACELIFT ref_facelift,
                                             REF_INT edgeid, REF_INT faceid,
                                             REF_INT sense, REF_DBL t,
                                             REF_DBL *uv) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_INT i, cell_node, cell, edg_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT ncell, cells[2], edg_tri, tri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT linear_nodes[REF_CELL_MAX_SIZE_PER], tuv_sense;
  REF_DBL bary[3], clipu[3], clipv[3], faceuv[2];
  RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, sense, t, uv),
      "edge uv");

  if (ref_facelift_direct(ref_facelift)) {
    if (0 != sense) {
      /* IMPLEMENT sense here, will need surrogate jump support */
      /* uses EGADS edgeUV */
      return REF_SUCCESS;
    }
    RSS(ref_facelift_enclosing(ref_facelift, REF_GEOM_EDGE, edgeid, &t, &cell,
                               bary),
        "enclose");
    RUS(REF_EMPTY, cell, "no enclosing found");
    RSS(ref_node_clip_bary2(bary, clipu), "clip edge bary");
    RSS(ref_node_clip_bary2(bary, clipv), "clip edge bary");
    RSS(ref_cell_nodes(ref_facelift_edg(ref_facelift), cell, edg_nodes),
        "edg nodes");
    RSS(ref_cell_list_with2(ref_facelift_tri(ref_facelift), edg_nodes[0],
                            edg_nodes[1], 2, &ncell, cells),
        "more then two tris for edg");
    RAS(ncell > 0, "no tri found for edg");
    edg_tri = REF_EMPTY;
    for (i = 0; i < ncell; i++) {
      RSS(ref_cell_nodes(ref_facelift_tri(ref_facelift), cells[i], tri_nodes),
          "tri nodes");
      if (faceid ==
          tri_nodes[ref_cell_id_index(ref_facelift_tri(ref_facelift))]) {
        REIS(REF_EMPTY, edg_tri, "two tri found with id and sense=0");
        edg_tri = cells[i];
      }
    }
    RUS(REF_EMPTY, edg_tri, "edg tri not found with id");
    RSS(ref_cell_nodes(ref_facelift_tri(ref_facelift), edg_tri, tri_nodes),
        "edg tri nodes");
    linear_nodes[0] = tri_nodes[0];
    linear_nodes[1] = tri_nodes[1];
    linear_nodes[2] = tri_nodes[2];
    linear_nodes[3] =
        tri_nodes[ref_cell_id_index(ref_facelift_tri(ref_facelift))];

    { /* use the opposite node free uv for degen */
      REF_INT geom;
      RSS(ref_geom_find(ref_geom, edg_nodes[0], REF_GEOM_FACE, faceid, &geom),
          "geom");
      if (0 < ref_geom_degen(ref_geom, geom)) {
        clipv[0] = 0.0;
        clipv[1] = 1.0;
      }
      if (0 > ref_geom_degen(ref_geom, geom)) {
        clipu[0] = 0.0;
        clipu[1] = 1.0;
      }
      RSS(ref_geom_find(ref_geom, edg_nodes[1], REF_GEOM_FACE, faceid, &geom),
          "geom");
      if (0 < ref_geom_degen(ref_geom, geom)) {
        clipv[0] = 1.0;
        clipv[1] = 0.0;
      }
      if (0 > ref_geom_degen(ref_geom, geom)) {
        clipu[0] = 1.0;
        clipu[1] = 0.0;
      }
    }

    uv[0] = 0.0;
    uv[1] = 0.0;
    for (cell_node = 0; cell_node < 2; cell_node++) {
      RSS(ref_geom_cell_tuv(ref_geom, edg_nodes[cell_node], linear_nodes,
                            REF_GEOM_FACE, faceuv, &tuv_sense),
          "face uv");
      uv[0] += clipu[cell_node] * faceuv[0];
      uv[1] += clipv[cell_node] * faceuv[1];
    }

    RSS(ref_facelift_edge_face_watertight(ref_facelift, edgeid, faceid, sense,
                                          t, uv),
        "facelift watertight check");

  } else {
  }
  return REF_SUCCESS;
}